

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O0

void __thiscall HighsLp::applyScale(HighsLp *this)

{
  double dVar1;
  const_reference pvVar2;
  reference pvVar3;
  int *in_RDI;
  HighsScale *in_stack_00000008;
  HighsSparseMatrix *in_stack_00000010;
  HighsInt iRow;
  HighsInt iCol;
  HighsScale *scale;
  int local_18;
  int local_14;
  
  if (((*(byte *)(in_RDI + 0x94) & 1) == 0) &&
     (*(undefined1 *)(in_RDI + 0x94) = 0, (*(byte *)(in_RDI + 0x83) & 1) != 0)) {
    for (local_14 = 0; local_14 < *in_RDI; local_14 = local_14 + 1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x88),(long)local_14)
      ;
      dVar1 = *pvVar2;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)local_14);
      *pvVar3 = *pvVar3 / dVar1;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x88),(long)local_14)
      ;
      dVar1 = *pvVar2;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),(long)local_14);
      *pvVar3 = *pvVar3 / dVar1;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x88),(long)local_14)
      ;
      dVar1 = *pvVar2;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 2),(long)local_14);
      *pvVar3 = dVar1 * *pvVar3;
    }
    for (local_18 = 0; local_18 < in_RDI[1]; local_18 = local_18 + 1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x8e),(long)local_18)
      ;
      dVar1 = *pvVar2;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x14),(long)local_18)
      ;
      *pvVar3 = dVar1 * *pvVar3;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x8e),(long)local_18)
      ;
      dVar1 = *pvVar2;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1a),(long)local_18)
      ;
      *pvVar3 = dVar1 * *pvVar3;
    }
    HighsSparseMatrix::applyScale(in_stack_00000010,in_stack_00000008);
    *(undefined1 *)(in_RDI + 0x94) = 1;
  }
  return;
}

Assistant:

void HighsLp::applyScale() {
  // Ensure that any scaling is applied
  const HighsScale& scale = this->scale_;
  if (this->is_scaled_) {
    // Already scaled - so check that there is scaling and return
    assert(scale.has_scaling);
    return;
  }
  // No scaling currently applied
  this->is_scaled_ = false;
  if (scale.has_scaling) {
    // Apply the scaling to the bounds, costs and matrix, and record
    // that it has been applied
    for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
      this->col_lower_[iCol] /= scale.col[iCol];
      this->col_upper_[iCol] /= scale.col[iCol];
      this->col_cost_[iCol] *= scale.col[iCol];
    }
    for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
      this->row_lower_[iRow] *= scale.row[iRow];
      this->row_upper_[iRow] *= scale.row[iRow];
    }
    this->a_matrix_.applyScale(scale);
    this->is_scaled_ = true;
  }
}